

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O3

void __thiscall higan::Channel::HandleEvent(Channel *this)

{
  LogLevel LVar1;
  Logger local_328;
  Fmt local_110;
  
  if (this->connecting_ == false) {
    LVar1 = Logger::GetLogLevel();
    if ((int)LVar1 < 4) {
      Logger::Logger(&local_328,ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/Channel.cpp"
                     ,99,"HandleEvent");
      Fmt::Fmt(&local_110,"connection: %s closed!!!!!",(this->connection_name_)._M_dataplus._M_p);
      Logger::operator<<(&local_328,&local_110);
      Logger::~Logger(&local_328);
    }
  }
  else if (this->channel_error_ == true) {
    this->connecting_ = false;
    if ((this->error_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->error_callback_)._M_invoker)((_Any_data *)&this->error_callback_);
      return;
    }
  }
  else {
    if ((this->channel_readable_ == true) &&
       ((this->readable_callback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
      (*(this->readable_callback_)._M_invoker)((_Any_data *)&this->readable_callback_);
    }
    if ((this->channel_writable_ == true) &&
       ((this->writable_callback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
      (*(this->writable_callback_)._M_invoker)((_Any_data *)&this->writable_callback_);
      return;
    }
  }
  return;
}

Assistant:

void Channel::HandleEvent()
{
	if (!connecting_)
	{
		LOG_ERROR << higan::Fmt("connection: %s closed!!!!!", connection_name_.c_str());
		return;
	}

	if (channel_error_)
	{
		/**
		 * 默认在 错误和可读同时触发时执行错误回调
		 * 是否会丢失数据?
		 */
		connecting_ = false;
		if (error_callback_)
		{
			error_callback_();
		}
		return;
	}

	if (channel_readable_)
	{
		if (readable_callback_)
		{
			readable_callback_();
		}
	}

	if (channel_writable_)
	{
		if (writable_callback_)
		{
			writable_callback_();
		}
	}
}